

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::messageLoop(RpcConnectionState *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  undefined4 uVar3;
  long *plVar4;
  undefined4 uVar5;
  TransformPromiseNodeBase *pTVar6;
  ImmediatePromiseNode<kj::_::Void> *pIVar7;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_01;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_02;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_03;
  _func_int **in_RSI;
  PromiseNode *pPVar8;
  Disposer *pDVar9;
  Own<kj::_::ChainPromiseNode> OVar10;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar11;
  Promise<void> PVar12;
  PromiseFulfillerPair<void> paf;
  Own<kj::_::PromiseNode> local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::PromiseNode> local_28;
  
  if (*(int *)(in_RSI + 9) == 1) {
    if (in_RSI[0x144] < in_RSI[0x145]) {
      kj::newPromiseAndFulfiller<void>();
      uVar3 = (undefined4)uStack_40;
      uVar5 = uStack_40._4_4_;
      uStack_40 = (long *)0x0;
      p_Var1 = in_RSI[0x146];
      p_Var2 = in_RSI[0x147];
      *(undefined4 *)(in_RSI + 0x146) = local_48;
      *(undefined4 *)((long)in_RSI + 0xa34) = uStack_44;
      *(undefined4 *)(in_RSI + 0x147) = uVar3;
      *(undefined4 *)((long)in_RSI + 0xa3c) = uVar5;
      if (p_Var2 != (_func_int *)0x0) {
        (*(code *)**(undefined8 **)p_Var1)(p_Var1,p_Var2 + *(long *)(*(long *)p_Var2 + -0x10));
      }
      pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar6,&local_58,
                 kj::_::
                 TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2081:31),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00643ef8;
      pTVar6[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
      local_28.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda()#1},kj::_::PropagateException>>
            ::instance;
      local_28.ptr = (PromiseNode *)pTVar6;
      OVar10 = kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                         ((kj *)&local_38,&local_28);
      pPVar8 = local_28.ptr;
      pIVar7 = (ImmediatePromiseNode<kj::_::Void> *)OVar10.ptr;
      *(undefined4 *)&(this->super_ErrorHandler)._vptr_ErrorHandler = local_38.disposer._0_4_;
      *(undefined4 *)((long)&(this->super_ErrorHandler)._vptr_ErrorHandler + 4) =
           local_38.disposer._4_4_;
      *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer = local_38.ptr._0_4_;
      *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) =
           local_38.ptr._4_4_;
      if ((TransformPromiseNodeBase *)local_28.ptr != (TransformPromiseNodeBase *)0x0) {
        local_28.ptr = (PromiseNode *)0x0;
        (**(local_28.disposer)->_vptr_Disposer)
                  (local_28.disposer,
                   ((PromiseNode *)&pPVar8->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar8->_vptr_PromiseNode)->_vptr_PromiseNode);
        pIVar7 = extraout_RDX;
      }
      plVar4 = uStack_40;
      if (uStack_40 != (long *)0x0) {
        uStack_40 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_44,local_48))
                  ((undefined8 *)CONCAT44(uStack_44,local_48),
                   (long)plVar4 + *(long *)(*plVar4 + -0x10));
        pIVar7 = extraout_RDX_00;
      }
      pPVar8 = local_58.ptr;
      if (local_58.ptr == (PromiseNode *)0x0) goto LAB_003be776;
      local_58.ptr = (PromiseNode *)0x0;
      pDVar9 = local_58.disposer;
    }
    else {
      (**(code **)(*(long *)in_RSI[0xb] + 8))(&local_38);
      pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar6,&local_38,
                 kj::_::
                 TransformPromiseNode<bool,_kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2087:9),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00643f80;
      pTVar6[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
      local_58.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<bool,kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>&&)#1},kj::_::PropagateException>>
            ::instance;
      local_58.ptr = (PromiseNode *)pTVar6;
      pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar6,&local_58,
                 kj::_::
                 TransformPromiseNode<kj::_::Void,_bool,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2095:13),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      pPVar8 = local_58.ptr;
      (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00645ae0;
      pTVar6[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
      (this->super_ErrorHandler)._vptr_ErrorHandler =
           (_func_int **)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,bool,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(bool)#1},kj::_::PropagateException>>
            ::instance;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pTVar6;
      pIVar7 = extraout_RDX_01;
      if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
        local_58.ptr = (PromiseNode *)0x0;
        (**(local_58.disposer)->_vptr_Disposer)
                  (local_58.disposer,
                   ((PromiseNode *)&pPVar8->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar8->_vptr_PromiseNode)->_vptr_PromiseNode);
        pIVar7 = extraout_RDX_02;
      }
      pPVar8 = local_38.ptr;
      if (local_38.ptr == (PromiseNode *)0x0) goto LAB_003be776;
      local_38.ptr = (PromiseNode *)0x0;
      pDVar9 = (Disposer *)CONCAT44(local_38.disposer._4_4_,local_38.disposer._0_4_);
    }
    (**pDVar9->_vptr_Disposer)
              (pDVar9,pPVar8->_vptr_PromiseNode[-2] + (long)&pPVar8->_vptr_PromiseNode);
    pIVar7 = extraout_RDX_03;
  }
  else {
    OVar11 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_58);
    pIVar7 = OVar11.ptr;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_58.disposer;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_58.ptr;
  }
LAB_003be776:
  PVar12.super_PromiseBase.node.ptr = (PromiseNode *)pIVar7;
  PVar12.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar12.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> messageLoop() {
    if (!connection.is<Connected>()) {
      return kj::READY_NOW;
    }

    if (callWordsInFlight > flowLimit) {
      auto paf = kj::newPromiseAndFulfiller<void>();
      flowWaiter = kj::mv(paf.fulfiller);
      return paf.promise.then([this]() {
        return messageLoop();
      });
    }

    return connection.get<Connected>()->receiveIncomingMessage().then(
        [this](kj::Maybe<kj::Own<IncomingRpcMessage>>&& message) {
      KJ_IF_MAYBE(m, message) {
        handleMessage(kj::mv(*m));
        return true;
      } else {
        disconnect(KJ_EXCEPTION(DISCONNECTED, "Peer disconnected."));
        return false;
      }
    }).then([this](bool keepGoing) {
      // No exceptions; continue loop.
      //
      // (We do this in a separate continuation to handle the case where exceptions are
      // disabled.)
      if (keepGoing) tasks.add(messageLoop());
    });
  }